

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_context_get_device_info__pulse
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_device_info_conflict *pDeviceInfo)

{
  ma_result mVar1;
  ma_pa_operation *pOP;
  code *pcVar2;
  ma_context_get_device_info_callback_data__pulse callbackData;
  ma_device_info_conflict *local_30;
  ma_uint32 local_28;
  int local_24;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x4589,
                  "ma_result ma_context_get_device_info__pulse(ma_context *, ma_device_type, const ma_device_id *, ma_device_info *)"
                 );
  }
  local_24 = 0;
  local_30 = pDeviceInfo;
  mVar1 = ma_context_get_default_device_index__pulse(pContext,deviceType,&local_28);
  pcVar2 = ma_context_get_device_info_source_callback__pulse;
  if (deviceType == ma_device_type_playback) {
    pcVar2 = ma_context_get_device_info_sink_callback__pulse;
  }
  pOP = (ma_pa_operation *)
        (**(code **)((long)&pContext->field_14 +
                    (ulong)(deviceType != ma_device_type_playback) * 8 + 0xe0))
                  ((pContext->field_14).alsa.snd_pcm_poll_descriptors,pDeviceID,pcVar2,&local_30);
  if (pOP == (ma_pa_operation *)0x0) {
    mVar1 = MA_ERROR;
  }
  else {
    ma_wait_for_operation__pulse(pContext,(pContext->field_14).pulse.pMainLoop,pOP);
    (*(pContext->field_14).alsa.snd_pcm_hw_params)(pOP);
    if (local_24 == 0) {
      mVar1 = MA_NO_DEVICE;
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_context_get_device_info__pulse(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_device_info* pDeviceInfo)
{
    ma_result result = MA_SUCCESS;
    ma_context_get_device_info_callback_data__pulse callbackData;
    ma_pa_operation* pOP = NULL;
    const char* pDeviceName = NULL;

    MA_ASSERT(pContext != NULL);

    callbackData.pDeviceInfo = pDeviceInfo;
    callbackData.foundDevice = MA_FALSE;

    if (pDeviceID != NULL) {
        pDeviceName = pDeviceID->pulse;
    } else {
        pDeviceName = NULL;
    }

    result = ma_context_get_default_device_index__pulse(pContext, deviceType, &callbackData.defaultDeviceIndex);

    if (deviceType == ma_device_type_playback) {
        pOP = ((ma_pa_context_get_sink_info_by_name_proc)pContext->pulse.pa_context_get_sink_info_by_name)((ma_pa_context*)(pContext->pulse.pPulseContext), pDeviceName, ma_context_get_device_info_sink_callback__pulse, &callbackData);
    } else {
        pOP = ((ma_pa_context_get_source_info_by_name_proc)pContext->pulse.pa_context_get_source_info_by_name)((ma_pa_context*)(pContext->pulse.pPulseContext), pDeviceName, ma_context_get_device_info_source_callback__pulse, &callbackData);
    }

    if (pOP != NULL) {
        ma_wait_for_operation_and_unref__pulse(pContext, pContext->pulse.pMainLoop, pOP);
    } else {
        result = MA_ERROR;
        goto done;
    }

    if (!callbackData.foundDevice) {
        result = MA_NO_DEVICE;
        goto done;
    }

done:
    return result;
}